

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

int64_t helper_cvttsd2sq_x86_64(CPUX86State *env,ZMMReg *s)

{
  int64_t iVar1;
  ZMMReg *s_local;
  CPUX86State *env_local;
  
  iVar1 = x86_float64_to_int64_round_to_zero(s->_d_ZMMReg[0],&env->sse_status);
  return iVar1;
}

Assistant:

int64_t helper_cvttsd2sq(CPUX86State *env, ZMMReg *s)
{
    return x86_float64_to_int64_round_to_zero(s->ZMM_D(0), &env->sse_status);
}